

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O1

void __thiscall ctemplate::BaseArena::FreeBlocks(BaseArena *this)

{
  vector<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
  *pvVar1;
  AllocatedBlock *pAVar2;
  long lVar3;
  pointer pAVar4;
  
  if (1 < this->blocks_alloced_) {
    pAVar2 = this->first_blocks_;
    lVar3 = 1;
    do {
      pAVar2 = pAVar2 + 1;
      free(pAVar2->mem);
      lVar3 = lVar3 + 1;
      pAVar2->mem = (char *)0x0;
      pAVar2->size = 0;
    } while (lVar3 < this->blocks_alloced_);
  }
  this->blocks_alloced_ = 1;
  if (this->overflow_blocks_ !=
      (vector<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
       *)0x0) {
    for (pAVar4 = (this->overflow_blocks_->
                  super__Vector_base<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
                  )._M_impl.super__Vector_impl_data._M_start; pvVar1 = this->overflow_blocks_,
        pAVar4 != (pvVar1->
                  super__Vector_base<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
                  )._M_impl.super__Vector_impl_data._M_finish; pAVar4 = pAVar4 + 1) {
      free(pAVar4->mem);
    }
    if (pvVar1 != (vector<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
                   *)0x0) {
      pAVar4 = (pvVar1->
               super__Vector_base<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (pAVar4 != (pointer)0x0) {
        operator_delete(pAVar4);
      }
      operator_delete(pvVar1);
    }
    this->overflow_blocks_ =
         (vector<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
          *)0x0;
  }
  return;
}

Assistant:

void BaseArena::FreeBlocks() {
  for ( int i = 1; i < blocks_alloced_; ++i ) {  // keep first block alloced
    free(first_blocks_[i].mem);
    first_blocks_[i].mem = NULL;
    first_blocks_[i].size = 0;
  }
  blocks_alloced_ = 1;
  if (overflow_blocks_ != NULL) {
    vector<AllocatedBlock>::iterator it;
    for (it = overflow_blocks_->begin(); it != overflow_blocks_->end(); ++it) {
      free(it->mem);
    }
    delete overflow_blocks_;             // These should be used very rarely
    overflow_blocks_ = NULL;
  }
}